

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void register_opcode(disas_proc proc,uint16_t opcode,uint16_t mask)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined6 in_register_00000012;
  uint uVar4;
  uint uVar5;
  undefined6 in_register_00000032;
  ulong uVar6;
  disas_proc *pp_Var7;
  
  uVar4 = (uint)CONCAT62(in_register_00000032,opcode);
  uVar3 = (uint)CONCAT62(in_register_00000012,mask);
  if ((~uVar3 & uVar4) == 0) {
    uVar1 = 0x8000;
    do {
      uVar5 = uVar1;
      uVar1 = uVar5 >> 1;
    } while ((uVar5 & uVar3) != 0);
    iVar2 = 1;
    if (uVar5 != 0) {
      iVar2 = uVar5 * 2;
    }
    if (iVar2 != 0) {
      uVar6 = (ulong)(-iVar2 & uVar4);
      pp_Var7 = opcode_table + uVar6;
      do {
        if (((uint)uVar6 & uVar3) == uVar4) {
          *pp_Var7 = proc;
        }
        uVar6 = uVar6 + 1;
        pp_Var7 = pp_Var7 + 1;
      } while (uVar6 < iVar2 + (-iVar2 & uVar4));
    }
    return;
  }
  fprintf(_stderr,"qemu internal error: bogus opcode definition %04x/%04x\n");
  abort();
}

Assistant:

static void
register_opcode (disas_proc proc, uint16_t opcode, uint16_t mask)
{
  int i;
  int from;
  int to;

  /* Sanity check.  All set bits must be included in the mask.  */
  if (opcode & ~mask) {
      fprintf(stderr,
              "qemu internal error: bogus opcode definition %04x/%04x\n",
              opcode, mask);
      abort();
  }
  /*
   * This could probably be cleverer.  For now just optimize the case where
   * the top bits are known.
   */
  /* Find the first zero bit in the mask.  */
  i = 0x8000;
  while ((i & mask) != 0)
      i >>= 1;
  /* Iterate over all combinations of this and lower bits.  */
  if (i == 0)
      i = 1;
  else
      i <<= 1;
  from = opcode & ~(i - 1);
  to = from + i;
  for (i = from; i < to; i++) {
      if ((i & mask) == opcode)
          opcode_table[i] = proc;
  }
}